

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream.c
# Opt level: O0

UINT8 AudioDrv_Init(UINT32 drvID,void **retDrvStruct)

{
  undefined8 uVar1;
  UINT8 UVar2;
  UINT32 UVar3;
  ADRV_INSTANCE *pAVar4;
  undefined4 extraout_var;
  UINT32 extraout_EDX;
  undefined1 *puVar5;
  undefined8 uStack_38;
  UINT8 retVal;
  void *drvData;
  ADRV_INSTANCE *audInst;
  AUDIO_DRV *tempDrv;
  ADRV_LOAD *tempDLoad;
  void **retDrvStruct_local;
  UINT32 drvID_local;
  
  if (drvID < audDrvCount) {
    tempDrv = (AUDIO_DRV *)(audDrvLoaded + drvID);
    if (((tempDrv->drvInfo).drvType & 1) == 0) {
      retDrvStruct_local._7_1_ = '\"';
    }
    else {
      audInst = (ADRV_INSTANCE *)(tempDrv->drvInfo).drvName;
      tempDLoad = (ADRV_LOAD *)retDrvStruct;
      retDrvStruct_local._0_4_ = drvID;
      if (((tempDrv->drvInfo).drvType & 2) == 0) {
        UVar2 = (*((AUDIO_DRV *)audInst)->Init)();
        if (UVar2 != '\0') {
          return UVar2;
        }
        (tempDrv->drvInfo).drvType = (tempDrv->drvInfo).drvType | 2;
      }
      puVar5 = (undefined1 *)&stack0xffffffffffffffc8;
      retDrvStruct_local._7_1_ = (*(code *)audInst->forwardDrvs)();
      if (retDrvStruct_local._7_1_ == '\0') {
        pAVar4 = GetFreeRunSlot();
        pAVar4->drvStruct = (AUDIO_DRV *)audInst;
        drvData = pAVar4;
        UVar3 = (*audInst->mainCallback)(puVar5,retDrvStruct,extraout_EDX,audInst);
        uVar1 = *(undefined8 *)CONCAT44(extraout_var,UVar3);
        (pAVar4->drvOpts).sampleRate = (int)uVar1;
        (pAVar4->drvOpts).numChannels = (char)((ulong)uVar1 >> 0x20);
        (pAVar4->drvOpts).numBitsPerSmpl = (char)((ulong)uVar1 >> 0x28);
        *(short *)&(pAVar4->drvOpts).field_0x6 = (short)((ulong)uVar1 >> 0x30);
        uVar1 = ((undefined8 *)CONCAT44(extraout_var,UVar3))[1];
        (pAVar4->drvOpts).usecPerBuf = (int)uVar1;
        (pAVar4->drvOpts).numBuffers = (int)((ulong)uVar1 >> 0x20);
        *(undefined8 *)((long)drvData + 0x20) = uStack_38;
        *(undefined8 *)((long)drvData + 0x28) = 0;
        *(undefined8 *)((long)drvData + 0x30) = 0;
        *(undefined8 *)((long)drvData + 0x38) = 0;
        *(undefined8 *)((long)drvData + 0x40) = 0;
        OSMutex_Init((OS_MUTEX **)((long)drvData + 0x40),'\0');
        *(void **)tempDLoad = drvData;
        retDrvStruct_local._7_1_ = '\0';
      }
    }
  }
  else {
    retDrvStruct_local._7_1_ = '!';
  }
  return retDrvStruct_local._7_1_;
}

Assistant:

UINT8 AudioDrv_Init(UINT32 drvID, void** retDrvStruct)
{
	ADRV_LOAD* tempDLoad;
	AUDIO_DRV* tempDrv;
	ADRV_INSTANCE* audInst;
	void* drvData;
	UINT8 retVal;
	
	if (drvID >= audDrvCount)
		return AERR_INVALID_DRV;
	tempDLoad = &audDrvLoaded[drvID];
	if (! (tempDLoad->flags & ADFLG_ENABLE))
		return AERR_DRV_DISABLED;
	
	tempDrv = tempDLoad->drvStruct;
	if (! (tempDLoad->flags & ADFLG_IS_INIT))
	{
		retVal = tempDrv->Init();
		if (retVal)
			return retVal;
		tempDLoad->flags |= ADFLG_IS_INIT;
	}
	
	retVal = tempDrv->Create(&drvData);
	if (retVal)
		return retVal;
	audInst = GetFreeRunSlot();
	audInst->drvStruct = tempDrv;
	audInst->drvOpts = *tempDrv->GetDefOpts();
	audInst->drvData = drvData;
	audInst->userParam = NULL;
	audInst->mainCallback = NULL;
	audInst->forwardDrvs = NULL;
	audInst->hMutex = NULL;
	OSMutex_Init(&audInst->hMutex, 0);
	*retDrvStruct = (void*)audInst;
	
	return AERR_OK;
}